

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

SubControl __thiscall
QAbstractSpinBoxPrivate::newHoverControl(QAbstractSpinBoxPrivate *this,QPoint *pos)

{
  SubControl SVar1;
  QAbstractSpinBox *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QAbstractSpinBox *q;
  QStyleOptionSpinBox opt;
  undefined4 in_stack_ffffffffffffff48;
  SubControl in_stack_ffffffffffffff4c;
  undefined4 uVar5;
  QFlags<QStyle::SubControl> *this_00;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QFlags<QStyle::SubControl> *)&local_68;
  QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)0x68a6b1);
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1c0))(pQVar2,this_00);
  QFlags<QStyle::SubControl>::QFlags(this_00,in_stack_ffffffffffffff4c);
  local_28 = (undefined1 *)CONCAT44(local_28._4_4_,local_6c);
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar5 = 0;
  SVar1 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,0,this_00,in_RSI,pQVar2);
  in_RDI->hoverControl = SVar1;
  pQVar3 = QWidget::style((QWidget *)CONCAT44(uVar5,in_stack_ffffffffffffff48));
  QVar4 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))
                           (pQVar3,uVar5,this_00,in_RDI->hoverControl,pQVar2);
  in_RDI->hoverRect = QVar4;
  SVar1 = in_RDI->hoverControl;
  QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x68a780);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QAbstractSpinBoxPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QAbstractSpinBox);

    QStyleOptionSpinBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_SpinBox, &opt, pos, q);
    hoverRect = q->style()->subControlRect(QStyle::CC_SpinBox, &opt, hoverControl, q);
    return hoverControl;
}